

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.hpp
# Opt level: O2

void __thiscall helics::Filter::Filter(Filter *this)

{
  (this->super_Interface).mCore = (Core *)0x0;
  (this->super_Interface).handle.hid = -1700000000;
  (this->super_Interface).mName._M_dataplus._M_p = (pointer)&(this->super_Interface).mName.field_2;
  (this->super_Interface).mName._M_string_length = 0;
  (this->super_Interface).mName.field_2._M_local_buf[0] = '\0';
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Filter_00455858;
  this->cloning = false;
  this->disableAssign = false;
  (this->filtOp).super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->filtOp).super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

Interface(Core* core, InterfaceHandle hid, std::string_view actName):
        mCore(core), handle(hid), mName(actName)
    {
    }